

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::SectionInfo::SectionInfo(SectionInfo *this,SourceLineInfo *_lineInfo,string *_name)

{
  size_t sVar1;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  sVar1 = _lineInfo->line;
  (this->lineInfo).file = _lineInfo->file;
  (this->lineInfo).line = sVar1;
  return;
}

Assistant:

SectionInfo::SectionInfo
    (SourceLineInfo const& _lineInfo,
        std::string const& _name)
        : name(_name),
        lineInfo(_lineInfo) {
    }